

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O1

void obj_no_longer_held(obj *obj)

{
  uint uVar1;
  obj *contents;
  obj *obj_00;
  
  if (obj != (obj *)0x0) {
    if (((ushort)obj->otyp - 0xda < 8) || (obj->otyp == 0x215)) {
      for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
        obj_no_longer_held(obj_00);
      }
    }
    if ((obj->otyp == 0x1a) &&
       (((obj->field_0x4b & 0x10) == 0 ||
        (uVar1 = mt_random(),
        (uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))))
    {
      obj->otyp = 0x19;
      obj->field_0x4b = obj->field_0x4b & 0xef;
    }
  }
  return;
}

Assistant:

void obj_no_longer_held(struct obj *obj)
{
	if (!obj) {
	    return;
	} else if ((Is_container(obj) || obj->otyp == STATUE) && obj->cobj) {
	    struct obj *contents;
	    for (contents=obj->cobj; contents; contents=contents->nobj)
		obj_no_longer_held(contents);
	}
	switch(obj->otyp) {
	case CRYSKNIFE:
	    /* KMH -- Fixed crysknives have only 10% chance of reverting */
	    /* only changes when not held by player or monster */
	    if (!obj->oerodeproof || !rn2(10)) {
		obj->otyp = WORM_TOOTH;
		obj->oerodeproof = 0;
	    }
	    break;
	}
}